

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall args::Group::Matched(Group *this)

{
  bool bVar1;
  Group *this_local;
  
  bVar1 = std::function<bool_(const_args::Group_&)>::operator()(&this->validator,this);
  return bVar1;
}

Assistant:

virtual bool Matched() const noexcept override
            {
                return validator(*this);
            }